

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlregexp.c
# Opt level: O0

int xmlFAParseAtom(xmlRegParserCtxtPtr ctxt)

{
  xmlRegStatePtr pxVar1;
  xmlRegStatePtr pxVar2;
  xmlRegStatePtr pxVar3;
  xmlRegAtomPtr pxVar4;
  xmlRegStatePtr start0;
  xmlRegStatePtr oldend;
  xmlRegStatePtr start;
  int len;
  int codepoint;
  xmlRegParserCtxtPtr ctxt_local;
  
  _len = ctxt;
  start._4_4_ = xmlFAIsChar(ctxt);
  if (start._4_4_ < 1) {
    if (*_len->cur == '|') {
      ctxt_local._4_4_ = 0;
    }
    else if (*_len->cur == '\0') {
      ctxt_local._4_4_ = 0;
    }
    else if (*_len->cur == ')') {
      ctxt_local._4_4_ = 0;
    }
    else if (*_len->cur == '(') {
      _len->cur = _len->cur + 1;
      if (_len->depth < 0x32) {
        xmlFAGenerateEpsilonTransition(_len,_len->state,(xmlRegStatePtr)0x0);
        pxVar1 = _len->state;
        xmlFAGenerateEpsilonTransition(_len,_len->state,(xmlRegStatePtr)0x0);
        pxVar2 = _len->state;
        pxVar3 = _len->end;
        _len->end = (xmlRegStatePtr)0x0;
        _len->atom = (xmlRegAtomPtr)0x0;
        _len->depth = _len->depth + 1;
        xmlFAParseRegExp(_len,0);
        _len->depth = _len->depth + -1;
        if (*_len->cur == ')') {
          _len->cur = _len->cur + 1;
        }
        else {
          _len->error = 0x5aa;
          xmlRegexpErrCompile(_len,"xmlFAParseAtom: expecting \')\'");
        }
        pxVar4 = xmlRegNewAtom(_len,XML_REGEXP_SUBREG);
        _len->atom = pxVar4;
        if (_len->atom == (xmlRegAtomPtr)0x0) {
          ctxt_local._4_4_ = -1;
        }
        else {
          _len->atom->start = pxVar2;
          _len->atom->start0 = pxVar1;
          _len->atom->stop = _len->state;
          _len->end = pxVar3;
          ctxt_local._4_4_ = 1;
        }
      }
      else {
        _len->error = 0x5aa;
        xmlRegexpErrCompile(_len,"xmlFAParseAtom: maximum nesting depth exceeded");
        ctxt_local._4_4_ = -1;
      }
    }
    else if (((*_len->cur == '[') || (*_len->cur == '\\')) || (*_len->cur == '.')) {
      xmlFAParseCharClass(_len);
      ctxt_local._4_4_ = 1;
    }
    else {
      ctxt_local._4_4_ = 0;
    }
  }
  else {
    pxVar4 = xmlRegNewAtom(_len,XML_REGEXP_CHARVAL);
    _len->atom = pxVar4;
    if (_len->atom == (xmlRegAtomPtr)0x0) {
      ctxt_local._4_4_ = -1;
    }
    else {
      start._0_4_ = 4;
      start._4_4_ = xmlGetUTF8Char(_len->cur,(int *)&start);
      if (start._4_4_ < 0) {
        _len->error = 0x5aa;
        xmlRegexpErrCompile(_len,"Invalid UTF-8");
        ctxt_local._4_4_ = -1;
      }
      else {
        _len->atom->codepoint = start._4_4_;
        _len->cur = _len->cur + (int)start;
        ctxt_local._4_4_ = 1;
      }
    }
  }
  return ctxt_local._4_4_;
}

Assistant:

static int
xmlFAParseAtom(xmlRegParserCtxtPtr ctxt) {
    int codepoint, len;

    codepoint = xmlFAIsChar(ctxt);
    if (codepoint > 0) {
	ctxt->atom = xmlRegNewAtom(ctxt, XML_REGEXP_CHARVAL);
	if (ctxt->atom == NULL)
	    return(-1);
        len = 4;
        codepoint = xmlGetUTF8Char(ctxt->cur, &len);
        if (codepoint < 0) {
            ERROR("Invalid UTF-8");
            return(-1);
        }
	ctxt->atom->codepoint = codepoint;
	NEXTL(len);
	return(1);
    } else if (CUR == '|') {
	return(0);
    } else if (CUR == 0) {
	return(0);
    } else if (CUR == ')') {
	return(0);
    } else if (CUR == '(') {
	xmlRegStatePtr start, oldend, start0;

	NEXT;
        if (ctxt->depth >= 50) {
	    ERROR("xmlFAParseAtom: maximum nesting depth exceeded");
            return(-1);
        }
	/*
	 * this extra Epsilon transition is needed if we count with 0 allowed
	 * unfortunately this can't be known at that point
	 */
	xmlFAGenerateEpsilonTransition(ctxt, ctxt->state, NULL);
	start0 = ctxt->state;
	xmlFAGenerateEpsilonTransition(ctxt, ctxt->state, NULL);
	start = ctxt->state;
	oldend = ctxt->end;
	ctxt->end = NULL;
	ctxt->atom = NULL;
        ctxt->depth++;
	xmlFAParseRegExp(ctxt, 0);
        ctxt->depth--;
	if (CUR == ')') {
	    NEXT;
	} else {
	    ERROR("xmlFAParseAtom: expecting ')'");
	}
	ctxt->atom = xmlRegNewAtom(ctxt, XML_REGEXP_SUBREG);
	if (ctxt->atom == NULL)
	    return(-1);
	ctxt->atom->start = start;
	ctxt->atom->start0 = start0;
	ctxt->atom->stop = ctxt->state;
	ctxt->end = oldend;
	return(1);
    } else if ((CUR == '[') || (CUR == '\\') || (CUR == '.')) {
	xmlFAParseCharClass(ctxt);
	return(1);
    }
    return(0);
}